

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uTimer.cpp
# Opt level: O2

void __thiscall UTimer::UTimer(UTimer *this,string *m)

{
  rep rVar1;
  
  (this->start).__d.__r = 0;
  (this->stop).__d.__r = 0;
  std::__cxx11::string::string((string *)&this->message,(string *)m);
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->start).__d.__r = rVar1;
  return;
}

Assistant:

UTimer::UTimer (const std::string m) : message(m) {
	start		= std::chrono::high_resolution_clock::now();
}